

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

ZSTD_compressionParameters *
ZSTD_adjustCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_compressionParameters cPar,
          unsigned_long_long srcSize,size_t dictSize,ZSTD_cParamMode_e mode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ZSTD_compressionParameters ZVar3;
  unsigned_long_long uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  ZVar3 = cPar;
  if (mode == ZSTD_cpm_attachDict) {
    dictSize = 0;
  }
  else if (mode == ZSTD_cpm_createCDict) {
    uVar4 = 0x201;
    if (dictSize == 0) {
      uVar4 = srcSize;
    }
    if (srcSize == 0xffffffffffffffff) {
      srcSize = uVar4;
    }
  }
  if ((srcSize | dictSize) < 0x40000000) {
    uVar5 = (int)(srcSize + dictSize) - 1;
    uVar6 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar5 = 6;
    if (0x3f < srcSize + dictSize) {
      uVar5 = (uVar6 ^ 0xffffffe0) + 0x21;
    }
    if (uVar5 < cPar.windowLog) {
      cPar.windowLog = uVar5;
    }
  }
  else if (srcSize == 0xffffffffffffffff) goto LAB_001b34d0;
  uVar6 = cPar.windowLog;
  if ((dictSize != 0) && (uVar7 = 1L << ((byte)cPar.windowLog & 0x3f), uVar7 < srcSize + dictSize))
  {
    uVar7 = uVar7 + dictSize;
    uVar6 = 0x1f;
    if (uVar7 < 0x80000000) {
      uVar5 = (int)uVar7 - 1;
      uVar6 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = (uVar6 ^ 0xffffffe0) + 0x21;
    }
  }
  uVar5 = (cPar.chainLog - 1) + (uint)(cPar.strategy < ZSTD_btlazy2);
  if (uVar6 + 1 < cPar.hashLog) {
    cPar.hashLog = uVar6 + 1;
  }
  if (uVar6 < uVar5) {
    cPar.chainLog = (cPar.chainLog + uVar6) - uVar5;
  }
LAB_001b34d0:
  if (cPar.windowLog < 10) {
    cPar.windowLog = 10;
  }
  uVar1 = ZVar3._12_8_;
  uVar2 = ZVar3._20_8_;
  __return_storage_ptr__->searchLog = (int)uVar1;
  __return_storage_ptr__->minMatch = (int)((ulong)uVar1 >> 0x20);
  __return_storage_ptr__->targetLength = (int)uVar2;
  __return_storage_ptr__->strategy = (int)((ulong)uVar2 >> 0x20);
  __return_storage_ptr__->windowLog = cPar.windowLog;
  __return_storage_ptr__->chainLog = cPar.chainLog;
  __return_storage_ptr__->hashLog = cPar.hashLog;
  __return_storage_ptr__->searchLog = cPar.searchLog;
  return &cPar;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_adjustCParams_internal(ZSTD_compressionParameters cPar,
                            unsigned long long srcSize,
                            size_t dictSize,
                            ZSTD_cParamMode_e mode)
{
    const U64 minSrcSize = 513; /* (1<<9) + 1 */
    const U64 maxWindowResize = 1ULL << (ZSTD_WINDOWLOG_MAX-1);
    assert(ZSTD_checkCParams(cPar)==0);

    switch (mode) {
    case ZSTD_cpm_unknown:
    case ZSTD_cpm_noAttachDict:
        /* If we don't know the source size, don't make any
         * assumptions about it. We will already have selected
         * smaller parameters if a dictionary is in use.
         */
        break;
    case ZSTD_cpm_createCDict:
        /* Assume a small source size when creating a dictionary
         * with an unkown source size.
         */
        if (dictSize && srcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            srcSize = minSrcSize;
        break;
    case ZSTD_cpm_attachDict:
        /* Dictionary has its own dedicated parameters which have
         * already been selected. We are selecting parameters
         * for only the source.
         */
        dictSize = 0;
        break;
    default:
        assert(0);
        break;
    }

    /* resize windowLog if input is small enough, to use less memory */
    if ( (srcSize < maxWindowResize)
      && (dictSize < maxWindowResize) )  {
        U32 const tSize = (U32)(srcSize + dictSize);
        static U32 const hashSizeMin = 1 << ZSTD_HASHLOG_MIN;
        U32 const srcLog = (tSize < hashSizeMin) ? ZSTD_HASHLOG_MIN :
                            ZSTD_highbit32(tSize-1) + 1;
        if (cPar.windowLog > srcLog) cPar.windowLog = srcLog;
    }
    if (srcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
        U32 const dictAndWindowLog = ZSTD_dictAndWindowLog(cPar.windowLog, (U64)srcSize, (U64)dictSize);
        U32 const cycleLog = ZSTD_cycleLog(cPar.chainLog, cPar.strategy);
        if (cPar.hashLog > dictAndWindowLog+1) cPar.hashLog = dictAndWindowLog+1;
        if (cycleLog > dictAndWindowLog)
            cPar.chainLog -= (cycleLog - dictAndWindowLog);
    }

    if (cPar.windowLog < ZSTD_WINDOWLOG_ABSOLUTEMIN)
        cPar.windowLog = ZSTD_WINDOWLOG_ABSOLUTEMIN;  /* minimum wlog required for valid frame header */

    return cPar;
}